

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

void jieba_reset_separators(jieba_t *handle,char *sep)

{
  char *in_RSI;
  Jieba *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  cppjieba::Jieba::ResetSeparators(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void jieba_reset_separators(jieba_t* handle, const char* sep) {
  ((cppjieba::Jieba*)handle)->ResetSeparators(sep);
}